

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockingQueue.h
# Opt level: O0

void __thiscall
Liby::BlockingQueue<std::function<void_()>_>::push_back
          (BlockingQueue<std::function<void_()>_> *this,const_reference_type e)

{
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> G_;
  const_reference_type e_local;
  BlockingQueue<std::function<void_()>_> *this_local;
  
  G_._M_device = (mutex_type *)e;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->mutex_);
  std::__cxx11::list<std::function<void()>,std::allocator<std::function<void()>>>::
  emplace_back<std::function<void()>const&>
            ((list<std::function<void()>,std::allocator<std::function<void()>>> *)&this->queue_,
             (function<void_()> *)G_._M_device);
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return;
}

Assistant:

void push_back(const_reference_type e) {
        std::lock_guard<std::mutex> G_(mutex_);
        queue_.emplace_back(e);
    }